

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

void Gia_ManDupDemiterOrderXors2(Gia_Man_t *p,Vec_Int_t *vXors)

{
  int iVar1;
  undefined8 in_RAX;
  Vec_Int_t *p_00;
  int *piVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  int iObj;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(400);
  p_00->pArray = piVar2;
  if (vXors->nSize < 1) {
    iVar1 = 0;
  }
  else {
    lVar5 = 0;
    do {
      uStack_38 = CONCAT44(vXors->pArray[lVar5],(undefined4)uStack_38);
      iVar1 = Gia_ManSuppSize(p,(int *)((long)&uStack_38 + 4),1);
      Vec_IntPush(p_00,iVar1);
      lVar5 = lVar5 + 1;
    } while (lVar5 < vXors->nSize);
    piVar2 = p_00->pArray;
    iVar1 = p_00->nSize;
  }
  piVar2 = Abc_MergeSortCost(piVar2,iVar1);
  p_00->nSize = 0;
  uVar3 = (ulong)(uint)vXors->nSize;
  if (vXors->nSize < 1) {
    uVar4 = 0;
    if (piVar2 != (int *)0x0) goto LAB_001f4412;
    vXors->nSize = 0;
    piVar2 = p_00->pArray;
LAB_001f4452:
    if (piVar2 == (int *)0x0) goto LAB_001f445f;
  }
  else {
    lVar5 = 0;
    do {
      iVar1 = piVar2[lVar5];
      if (((long)iVar1 < 0) || ((int)uVar3 <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(p_00,vXors->pArray[iVar1]);
      lVar5 = lVar5 + 1;
      uVar3 = (ulong)vXors->nSize;
    } while (lVar5 < (long)uVar3);
    uVar4 = p_00->nSize;
LAB_001f4412:
    free(piVar2);
    vXors->nSize = 0;
    piVar2 = p_00->pArray;
    if ((int)uVar4 < 1) goto LAB_001f4452;
    uVar3 = 0;
    do {
      Vec_IntPush(vXors,piVar2[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  free(piVar2);
LAB_001f445f:
  free(p_00);
  return;
}

Assistant:

void Gia_ManDupDemiterOrderXors2( Gia_Man_t * p, Vec_Int_t * vXors )
{
    int i, iObj, * pPerm;
    Vec_Int_t * vSizes = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vXors, iObj, i )
        Vec_IntPush( vSizes, Gia_ManSuppSize(p, &iObj, 1) );
    pPerm = Abc_MergeSortCost( Vec_IntArray(vSizes), Vec_IntSize(vSizes) );
    Vec_IntClear( vSizes );
    for ( i = 0; i < Vec_IntSize(vXors); i++ )
        Vec_IntPush( vSizes, Vec_IntEntry(vXors, pPerm[i]) );
    ABC_FREE( pPerm );
    Vec_IntClear( vXors );
    Vec_IntAppend( vXors, vSizes );
    Vec_IntFree( vSizes );
}